

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O2

void __thiscall Assimp::FBX::Node::DumpChildren(Node *this,StreamWriterLE *s,bool binary,int indent)

{
  long lVar1;
  undefined7 in_register_00000011;
  ostringstream ss;
  string sStack_1b8;
  ostringstream local_198 [376];
  
  if ((int)CONCAT71(in_register_00000011,binary) != 0) {
    DumpChildrenBinary(this,s);
    return;
  }
  std::__cxx11::ostringstream::ostringstream(local_198);
  DumpChildrenAscii(this,(ostream *)local_198,indent);
  lVar1 = std::ostream::tellp();
  if (0 < lVar1) {
    std::__cxx11::stringbuf::str();
    StreamWriter<false,_false>::PutString(s,&sStack_1b8);
    std::__cxx11::string::~string((string *)&sStack_1b8);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void FBX::Node::DumpChildren(
    Assimp::StreamWriterLE& s,
    bool binary, int indent
) {
    if (binary) {
        DumpChildrenBinary(s);
    } else {
        std::ostringstream ss;
        DumpChildrenAscii(ss, indent);
        if (ss.tellp() > 0)
            s.PutString(ss.str());
    }
}